

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

FlagBase * __thiscall args::FlagBase::Match(FlagBase *this,char flag)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this_00;
  ostringstream problem;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  bVar1 = Matcher::Match(&this->matcher,flag);
  if (bVar1) {
    if (((this->super_NamedBase).field_0x51 == '\x01') &&
       ((this->super_NamedBase).super_Base.matched == true)) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Flag \'",6);
      local_1b0[0] = (string)flag;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_190,(char *)local_1b0,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"\' was passed multiple times, but is only allowed to be passed once",0x42);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1b0);
      *(undefined ***)this_00 = &PTR__runtime_error_00129b48;
      __cxa_throw(this_00,&ExtraError::typeinfo,std::runtime_error::~runtime_error);
    }
    (this->super_NamedBase).super_Base.matched = true;
  }
  else {
    this = (FlagBase *)0x0;
  }
  return this;
}

Assistant:

virtual FlagBase *Match(const char flag)
            {
                if (matcher.Match(flag))
                {
                    if (extraError && matched)
                    {
#ifdef ARGS_NOEXCEPT
                        error = Error::Extra;
#else
                        std::ostringstream problem;
                        problem << "Flag '" << flag << "' was passed multiple times, but is only allowed to be passed once";
                        throw ExtraError(problem.str());
#endif
                    }
                    matched = true;
                    return this;
                }
                return nullptr;
            }